

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O1

void * __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
::insertPositionRaw<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key)

{
  Node *pNVar1;
  result_type_conflict1 rVar2;
  Comparison CVar3;
  Node *pNVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  Node *pNVar9;
  Node *pNVar10;
  Top TVar11;
  Top local_50;
  Top local_40;
  
  local_40._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_40._inner._inner._content[7] = key._inner._inner._content[7];
  uVar6 = 0xffffffff;
  do {
    local_50._inner._inner._0_1_ = 0;
    local_50._inner._inner._content[0] = '\0';
    local_50._inner._inner._content[1] = '\0';
    local_50._inner._inner._content[2] = '\0';
    local_50._inner._inner._content[3] = '\x01';
    local_50._inner._inner._content[4] = '\0';
    local_50._inner._inner._content[5] = '\0';
    local_50._inner._inner._content[6] = '\0';
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_50,&Random::_eng,
                       (param_type *)&local_50);
    uVar6 = uVar6 + 1;
  } while (rVar2 != 0);
  uVar8 = this->_top;
  if (uVar8 <= uVar6) {
    if (uVar8 < 0x20) {
      this->_top = uVar8 + 1;
      uVar6 = uVar8;
    }
    else {
      uVar6 = uVar8 - 1;
    }
  }
  uVar7 = (ulong)uVar6 * 8 + 0x1f & 0xffffffff0;
  if (uVar7 == 0) {
    pNVar4 = (Node *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar7 < 0x11) {
    pNVar4 = (Node *)FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar7 < 0x19) {
    pNVar4 = (Node *)FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar7 < 0x21) {
    pNVar4 = (Node *)FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar7 < 0x31) {
    pNVar4 = (Node *)FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar7 < 0x41) {
    pNVar4 = (Node *)FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pNVar4 = (Node *)::operator_new(uVar7,0x10);
  }
  uVar8 = this->_top - 1;
  pNVar9 = this->_left;
  do {
    pNVar1 = pNVar9->nodes[uVar8];
    if (pNVar1 == (Node *)0x0) {
      if (uVar8 <= uVar6) {
        pNVar9->nodes[uVar8] = pNVar4;
        pNVar4->nodes[uVar8] = (Node *)0x0;
        if (uVar8 == 0) {
LAB_00336f26:
          iVar5 = 1;
          uVar8 = 0;
          pNVar10 = pNVar9;
          goto LAB_00336f2e;
        }
      }
      uVar8 = uVar8 - 1;
      iVar5 = 5;
      pNVar10 = pNVar9;
    }
    else {
      TVar11 = Kernel::TermList::top(&pNVar1->value->_term);
      local_50._inner._inner._0_8_ = TVar11._inner._inner._0_8_;
      local_50._inner._inner._content[7] = TVar11._inner._inner._content[7];
      CVar3 = Kernel::TermList::Top::compare(&local_40,&local_50);
      iVar5 = 0;
      pNVar10 = pNVar1;
      if ((1 < (uint)CVar3) && (pNVar10 = pNVar9, CVar3 == LESS)) {
        if (uVar8 <= uVar6) {
          pNVar4->nodes[uVar8] = pNVar1;
          pNVar9->nodes[uVar8] = pNVar4;
          if (uVar8 == 0) goto LAB_00336f26;
        }
        uVar8 = uVar8 - 1;
      }
    }
LAB_00336f2e:
    pNVar9 = pNVar10;
    if ((iVar5 != 0) && (iVar5 != 5)) {
      return pNVar4;
    }
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }